

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::allocateEvents(MidiFile *this,int track,int aSize)

{
  int iVar1;
  reference ppMVar2;
  int oldsize;
  int aSize_local;
  int track_local;
  MidiFile *this_local;
  
  ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,(long)track);
  iVar1 = MidiEventList::size(*ppMVar2);
  if (iVar1 < aSize) {
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)track);
    MidiEventList::reserve(*ppMVar2,aSize);
  }
  return;
}

Assistant:

void MidiFile::allocateEvents(int track, int aSize) {
	int oldsize = m_events[track]->size();
	if (oldsize < aSize) {
		m_events[track]->reserve(aSize);
	}
}